

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SectionStats::~SectionStats(SectionStats *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SectionStats_00343e60;
  SectionInfo::~SectionInfo((SectionInfo *)this);
  return;
}

Assistant:

SectionStats::~SectionStats() = default;